

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void dbgwvr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  byte bVar1;
  
  bVar1 = ri->crm;
  raw_write(env,ri,(long)(value << 0xf) >> 0xf & 0xfffffffffffffffc);
  hw_watchpoint_update_aarch64((ARMCPU_conflict1 *)(env[-4].vfp.zregs[0x17].d + 0x14),(uint)bVar1);
  return;
}

Assistant:

static void dbgwvr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                         uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    int i = ri->crm;

    /* Bits [63:49] are hardwired to the value of bit [48]; that is, the
     * register reads and behaves as if values written are sign extended.
     * Bits [1:0] are RES0.
     */
    value = sextract64(value, 0, 49) & ~3ULL;

    raw_write(env, ri, value);
    hw_watchpoint_update(cpu, i);
}